

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

bool __thiscall Bitmap::getPixelValue(Bitmap *this,int32_t pixel)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((uint)pixel < (uint)this->length) {
    uVar1 = (uint)this->data[pixel / 8];
  }
  return (bool)((byte)(uVar1 << ((byte)pixel & 7)) >> 7);
}

Assistant:

bool Bitmap::getPixelValue(const int32_t pixel)
{
   const int32_t index = pixel / 8;
   const uint8_t mask = (0x80 >> (pixel & 7));
   uint8_t data = 0;

   //ignore all pixel that does not fit onto the lable
   if ((uint32_t)pixel < this->length)
   {
      //read respective byte
      data = this->data[index];
   }
   return ((data & mask) != 0);
}